

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTest::TimestampTest
          (TimestampTest *this,TestContext *testContext,string *name,string *description,
          TimestampTestParam *param)

{
  tcu::TestCase::TestCase((TestCase *)this,testContext,(char *)name,(char *)description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TimestampTest_00d26b10;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&this->m_stages,&param->m_stageVec);
  this->m_inRenderPass = param->m_inRenderPass;
  return;
}

Assistant:

TimestampTest(tcu::TestContext&         testContext,
										const std::string&        name,
										const std::string&        description,
										const TimestampTestParam* param)
							  : vkt::TestCase  (testContext, name, description)
							  , m_stages       (param->getStageVector())
							  , m_inRenderPass (param->getInRenderPass())
							  { }